

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Print
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this,ostream *out)

{
  TPZCompEl *this_00;
  char cVar1;
  TPZTransform<double> *pTVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  TPZGeoEl *pTVar6;
  TPZGeoEl *pTVar7;
  ostream *poVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  TPZVec<double> *pTVar12;
  long lVar13;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> restraints;
  TPZVec<double> centerMaster;
  TPZVec<double> local_10c0;
  long local_10a0;
  double local_1098;
  TPZManVector<TPZTransform<double>,_10> local_1090;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,
             "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Print(std::ostream &) const [TGeometry = pzgeom::TPZGeoTetrahedra]"
             ,0x80);
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  TPZCompEl::Print((TPZCompEl *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Integration rule ",0x11);
  plVar5 = (long *)(**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl +
                               0x240))(this);
  (**(code **)(*plVar5 + 0x60))(plVar5,out);
  pTVar6 = TPZCompEl::Reference((TPZCompEl *)this);
  if (pTVar6 != (TPZGeoEl *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"\nCenter coordinate: ",0x14);
    pTVar6 = TPZCompEl::Reference((TPZCompEl *)this);
    iVar3 = (**(code **)(*(long *)pTVar6 + 0x210))(pTVar6);
    local_10c0._vptr_TPZVec = (_func_int **)0x0;
    TPZVec<double>::TPZVec((TPZVec<double> *)&local_1090,(long)iVar3,(double *)&local_10c0);
    local_1098 = 0.0;
    TPZVec<double>::TPZVec(&local_10c0,3,&local_1098);
    pTVar6 = TPZCompEl::Reference((TPZCompEl *)this);
    pTVar7 = TPZCompEl::Reference((TPZCompEl *)this);
    iVar3 = (**(code **)(*(long *)pTVar7 + 0xf0))(pTVar7);
    (**(code **)(*(long *)pTVar6 + 0x260))(pTVar6,iVar3 + -1,&local_1090);
    pTVar6 = TPZCompEl::Reference((TPZCompEl *)this);
    (**(code **)(*(long *)pTVar6 + 0x228))(pTVar6,&local_1090,&local_10c0);
    poVar8 = ::operator<<(out,&local_10c0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    local_10c0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_10c0.fStore != (double *)0x0) {
      operator_delete__(local_10c0.fStore);
    }
    local_1090.super_TPZVec<TPZTransform<double>_>._vptr_TPZVec =
         (_func_int **)&PTR__TPZVec_01813df0;
    if (local_1090.super_TPZVec<TPZTransform<double>_>.fStore != (TPZTransform<double> *)0x0) {
      operator_delete__(local_1090.super_TPZVec<TPZTransform<double>_>.fStore);
    }
  }
  lVar9 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))(this)
  ;
  if (lVar9 == 0) {
    pcVar10 = "No material\n";
    lVar9 = 0xc;
    poVar8 = out;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,"Material id ",0xc);
    plVar5 = (long *)(**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl +
                                 0xb8))(this);
    iVar3 = (**(code **)(*plVar5 + 0x58))(plVar5);
    poVar8 = (ostream *)std::ostream::operator<<(out,iVar3);
    pcVar10 = "\n";
    lVar9 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar10,lVar9);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Number of connects = ",0x15);
  iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))(this)
  ;
  std::ostream::operator<<(out,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Connect indexes : ",0x12);
  iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))(this)
  ;
  if (0 < iVar3) {
    iVar3 = 0;
    do {
      (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xa0))
                (this,iVar3);
      poVar8 = std::ostream::_M_insert<long>((long)out);
      local_1090.super_TPZVec<TPZTransform<double>_>._vptr_TPZVec =
           (_func_int **)
           CONCAT71(local_1090.super_TPZVec<TPZTransform<double>_>._vptr_TPZVec._1_7_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_1090,1);
      iVar3 = iVar3 + 1;
      iVar4 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))
                        (this);
    } while (iVar3 < iVar4);
  }
  pTVar6 = TPZCompEl::Reference((TPZCompEl *)this);
  if (pTVar6 != (TPZGeoEl *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"Reference Index = ",0x12);
    TPZCompEl::Reference((TPZCompEl *)this);
    poVar8 = std::ostream::_M_insert<long>((long)out);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x1a0))
            (&local_10c0,this);
  if (local_10c0.fNElements != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"One shape restraints\n",0x15);
    pTVar12 = &local_10c0;
    while (pTVar12 = (TPZVec<double> *)pTVar12->_vptr_TPZVec, pTVar12 != &local_10c0) {
      TPZOneShapeRestraint::Print((TPZOneShapeRestraint *)&pTVar12->fNElements,out);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"\nComputational elements within multi-physics element: \n",0x37);
  local_10a0 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
  if (0 < local_10a0) {
    lVar11 = 0xf0;
    lVar13 = 0;
    lVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (out,"\nComputational element belonging to the mesh ",0x2d);
      poVar8 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n",2);
      this_00 = *(TPZCompEl **)
                 ((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar13);
      if (this_00 == (TPZCompEl *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,"\n There is not element to computational mesh ",0x2d);
        poVar8 = std::ostream::_M_insert<long>((long)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      }
      else {
        (**(code **)(*(long *)this_00 + 200))(this_00,out);
        pTVar6 = TPZCompEl::Reference(this_00);
        if (pTVar6 != (TPZGeoEl *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"\tReference Index = ",0x13);
          TPZCompEl::Reference(this_00);
          std::ostream::_M_insert<long>((long)out);
          TPZManVector<TPZTransform<double>,_10>::TPZManVector(&local_1090,0);
          (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))
                    (this,&local_1090);
          std::__ostream_insert<char,std::char_traits<char>>
                    (out,
                     "\n\tAffine transformation of the multiphysics element for this computational element:"
                     ,0x53);
          std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
          pTVar2 = local_1090.super_TPZVec<TPZTransform<double>_>.fStore;
          std::__ostream_insert<char,std::char_traits<char>>(out,"mult = ",7);
          poVar8 = ::operator<<(out,(TPZMatrix<double> *)((long)pTVar2 + lVar11 + -0xe0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tsum = ",7);
          ::operator<<(poVar8,(TPZMatrix<double> *)
                              ((long)(pTVar2->fMult).super_TPZFMatrix<double>.fPivot.fExtAlloc +
                              lVar11 + -0x68));
          TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&local_1090);
        }
      }
      lVar9 = lVar9 + 1;
      lVar13 = lVar13 + 0x10;
      lVar11 = lVar11 + 0x1a0;
    } while (local_10a0 != lVar9);
  }
  std::__cxx11::_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_clear
            ((_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)&local_10c0)
  ;
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::Print(std::ostream & out) const {
    
    out << __PRETTY_FUNCTION__ << std::endl;
    TPZCompEl::Print(out);
    out << "Integration rule ";
    GetIntegrationRule().Print(out);
    if(this->Reference())
    {
        out << "\nCenter coordinate: ";
        TPZVec< REAL > centerMaster( this->Reference()->Dimension(),0. );
        TPZVec< REAL > centerEuclid( 3,0.);
        this->Reference()->CenterPoint(this->Reference()->NSides()-1,centerMaster);
        this->Reference()->X(centerMaster,centerEuclid);
        out << centerEuclid << std::endl;
    }
    if(this->Material())
    {
        out << "Material id " << this->Material()->Id() << "\n";
    }
    else {
        out << "No material\n";
    }
    
    out << "Number of connects = " << NConnects();
    out << "Connect indexes : ";
    int nod;
    for(nod=0; nod< NConnects(); nod++)
    {
        out << ConnectIndex(nod) <<  ' ' ;
    }
    if(this->Reference())
    {
        out << "Reference Index = " << this->Reference()->Index() << std::endl;
    }
    std::list<TPZOneShapeRestraint> restraints = this->GetShapeRestraints();
    if(restraints.size())
    {
        out << "One shape restraints\n";
        for (std::list<TPZOneShapeRestraint>::const_iterator it = restraints.begin(); it != restraints.end(); it++) {
            it->Print(out);
        }
    }
    
    out << "\nComputational elements within multi-physics element: \n";
    int64_t nmesh  = fElementVec.size();
    for(int64_t iel = 0; iel< nmesh; iel++ ){
        
        out << "\nComputational element belonging to the mesh " << iel <<":\n";
        TPZCompEl *cel = fElementVec[iel].Element();
        if(!cel){
            out << "\n There is not element to computational mesh " << iel <<"\n";
            continue;
        }
        cel->Print(out);
        if(!cel->Reference()) continue;
        out << "\tReference Index = " << cel->Reference()->Index();
        
        TPZManVector<TPZTransform<> > tr;
        AffineTransform(tr);
        out << "\n\tAffine transformation of the multiphysics element for this computational element:"<<"\n";
        out << std::endl;
        out <<"\t" << tr[iel];
    }
}